

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O3

const_iterator * __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::const_iterator::operator++(const_iterator *this)

{
  size_t sVar1;
  __node_type *p_Var2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  p_Var2 = (this->container_it).
           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur;
  sVar4 = this->pos;
  sVar1 = sVar4 + 1;
  this->pos = sVar1;
  if (sVar1 != 0x40) {
    uVar3 = *(ulong *)((long)&(p_Var2->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    sVar4 = sVar4 + 2;
    do {
      if ((uVar3 >> ((ulong)((int)sVar4 - 1U & 0xff) & 0x3f) & 1) != 0) {
        return this;
      }
      this->pos = sVar4;
      sVar4 = sVar4 + 1;
    } while (sVar4 != 0x41);
  }
  p_Var2 = (__node_type *)(p_Var2->super__Hash_node_base)._M_nxt;
  (this->container_it).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur = p_Var2;
  this->pos = 0;
  if (p_Var2 != (this->container_end).
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur) {
    uVar3 = *(ulong *)((long)&(p_Var2->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage + 8);
    uVar5 = 0;
    do {
      if ((uVar3 >> (uVar5 & 0x3f) & 1) != 0) {
        return this;
      }
      uVar5 = uVar5 + 1;
      this->pos = uVar5;
    } while (uVar5 != 0x40);
  }
  return this;
}

Assistant:

const_iterator &operator++() {
            // shift to the next bit in the current bits
            assert(pos < BITS_IN_BUCKET);
            assert(container_it != container_end && "operator++ called on end");
            if (++pos != BITS_IN_BUCKET)
                _findClosestBit();

            if (pos == BITS_IN_BUCKET) {
                ++container_it;
                pos = 0;
                if (container_it != container_end) {
                    assert(container_it->second != 0 &&
                           "Empty bucket in a bitvector");
                    _findClosestBit();
                }
            }
            return *this;
        }